

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodes_io.c
# Opt level: O2

int CVodeSetMonitorFrequency(void *cvode_mem,long nst)

{
  int line;
  int error_code;
  char *msgfmt;
  
  if (cvode_mem == (void *)0x0) {
    msgfmt = "cvode_mem = NULL illegal.";
    error_code = -0x15;
    line = 0x7f;
    cvode_mem = (CVodeMem)0x0;
  }
  else if (nst < 0) {
    msgfmt = "step interval must be >= 0\n";
    cvode_mem = (CVodeMem)0x0;
    error_code = -0x16;
    line = 0x85;
  }
  else {
    msgfmt = "SUNDIALS was not built with monitoring enabled.";
    error_code = -0x16;
    line = 0x90;
  }
  cvProcessError((CVodeMem)cvode_mem,error_code,line,"CVodeSetMonitorFrequency",
                 "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/cvodes/cvodes_io.c"
                 ,msgfmt);
  return error_code;
}

Assistant:

int CVodeSetMonitorFrequency(void* cvode_mem, long int nst)
{
  CVodeMem cv_mem;

  if (cvode_mem == NULL)
  {
    cvProcessError(NULL, CV_MEM_NULL, __LINE__, __func__, __FILE__, MSGCV_NO_MEM);
    return (CV_MEM_NULL);
  }

  if (nst < 0)
  {
    cvProcessError(NULL, CV_ILL_INPUT, __LINE__, __func__, __FILE__,
                   "step interval must be >= 0\n");
    return (CV_ILL_INPUT);
  }

  cv_mem = (CVodeMem)cvode_mem;

#ifdef SUNDIALS_BUILD_WITH_MONITORING
  cv_mem->cv_monitor_interval = nst;
  return (CV_SUCCESS);
#else
  cvProcessError(cv_mem, CV_ILL_INPUT, __LINE__, __func__, __FILE__,
                 "SUNDIALS was not built with monitoring enabled.");
  return (CV_ILL_INPUT);
#endif
}